

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O3

void __thiscall
Application::onMessage(Application *this,NewOrderSingle *message,SessionID *sessionID)

{
  char cVar1;
  __normal_iterator<const_FIX::FieldBase_*,_std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>_>
  _Var2;
  FieldBase *field;
  IncorrectTagValue *this_00;
  double dVar3;
  string local_698;
  string local_678;
  undefined1 local_658 [16];
  _Alloc_hider local_648;
  char local_638 [16];
  _Alloc_hider local_628;
  size_type local_620;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_618;
  field_metrics local_608;
  OrderQty orderQty;
  Price price;
  OrdType ordType;
  undefined1 local_4f8 [16];
  _Alloc_hider local_4e8;
  char local_4d8 [16];
  _Alloc_hider local_4c8;
  size_type local_4c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b8;
  field_metrics local_4a8;
  Account account;
  ClOrdID clOrdID;
  Side side;
  FieldBase local_398;
  FieldBase local_340;
  Symbol symbol;
  FieldBase local_290;
  FieldBase local_238;
  FieldBase local_1e0;
  ExecutionReport executionReport;
  
  FIX::StringField::StringField(&symbol.super_StringField,0x37);
  symbol.super_StringField.super_FieldBase._vptr_FieldBase = (_func_int **)&PTR__FieldBase_001484d8;
  FIX::CharField::CharField(&side.super_CharField,0x36);
  side.super_CharField.super_FieldBase._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00148510;
  FIX::CharField::CharField(&ordType.super_CharField,0x28);
  ordType.super_CharField.super_FieldBase._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00148580;
  FIX::DoubleField::DoubleField(&orderQty.super_QtyField,0x26);
  orderQty.super_QtyField.super_FieldBase._vptr_FieldBase = (_func_int **)&PTR__FieldBase_001485b8;
  FIX::DoubleField::DoubleField(&price.super_PriceField,0x2c);
  price.super_PriceField.super_FieldBase._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00148628;
  FIX::StringField::StringField(&clOrdID.super_StringField,0xb);
  clOrdID.super_StringField.super_FieldBase._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00148660
  ;
  FIX::StringField::StringField(&account.super_StringField,1);
  account.super_StringField.super_FieldBase._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00148698
  ;
  FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&ordType);
  cVar1 = FIX::CharField::getValue(&ordType.super_CharField);
  if (cVar1 == '2') {
    FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&symbol);
    FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&side);
    FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&orderQty);
    FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&price);
    FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&clOrdID);
    genOrderID_abi_cxx11_(&local_678,this);
    local_658._0_8_ = &PTR__FieldBase_00148480;
    local_658._8_4_ = 0x25;
    local_648._M_p = local_638;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_648,local_678._M_dataplus._M_p,
               local_678._M_dataplus._M_p + local_678._M_string_length);
    local_628._M_p = (pointer)&local_618;
    local_620 = 0;
    local_618._M_local_buf[0] = '\0';
    local_608.m_length = 0;
    local_608.m_checksum = 0;
    local_658._0_8_ = &PTR__FieldBase_00148778;
    genExecID_abi_cxx11_(&local_698,this);
    local_4f8._0_8_ = &PTR__FieldBase_00148480;
    local_4f8._8_4_ = 0x11;
    local_4e8._M_p = local_4d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4e8,local_698._M_dataplus._M_p,
               local_698._M_dataplus._M_p + local_698._M_string_length);
    local_4c8._M_p = (pointer)&local_4b8;
    local_4c0 = 0;
    local_4b8._M_local_buf[0] = '\0';
    local_4a8.m_length = 0;
    local_4a8.m_checksum = 0;
    local_4f8._0_8_ = &PTR__FieldBase_001487b0;
    FIX::CharField::CharField((CharField *)&local_340,0x96,'F');
    local_340._vptr_FieldBase = (_func_int **)&PTR__FieldBase_001489e0;
    FIX::CharField::CharField((CharField *)&local_398,0x27,'2');
    local_398._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00148820;
    FIX::DoubleField::DoubleField((DoubleField *)&local_1e0,0x97,0.0,0);
    local_1e0._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00148a18;
    dVar3 = FIX::DoubleField::getValue(&orderQty.super_QtyField);
    FIX::DoubleField::DoubleField((DoubleField *)&local_238,0xe,dVar3,0);
    local_238._vptr_FieldBase = (_func_int **)&PTR__FieldBase_001488c8;
    dVar3 = FIX::DoubleField::getValue(&price.super_PriceField);
    FIX::DoubleField::DoubleField((DoubleField *)&local_290,6,dVar3,0);
    local_290._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00148900;
    FIX44::ExecutionReport::ExecutionReport
              (&executionReport,(OrderID *)local_658,(ExecID *)local_4f8,(ExecType *)&local_340,
               (OrdStatus *)&local_398,&side,(LeavesQty *)&local_1e0,(CumQty *)&local_238,
               (AvgPx *)&local_290);
    FIX::FieldBase::~FieldBase(&local_290);
    FIX::FieldBase::~FieldBase(&local_238);
    FIX::FieldBase::~FieldBase(&local_1e0);
    FIX::FieldBase::~FieldBase(&local_398);
    FIX::FieldBase::~FieldBase(&local_340);
    FIX::FieldBase::~FieldBase((FieldBase *)local_4f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_698._M_dataplus._M_p != &local_698.field_2) {
      operator_delete(local_698._M_dataplus._M_p,local_698.field_2._M_allocated_capacity + 1);
    }
    FIX::FieldBase::~FieldBase((FieldBase *)local_658);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_678._M_dataplus._M_p != &local_678.field_2) {
      operator_delete(local_678._M_dataplus._M_p,local_678.field_2._M_allocated_capacity + 1);
    }
    FIX::FieldMap::setField((FieldMap *)&executionReport,(FieldBase *)&clOrdID,true);
    FIX::FieldMap::setField((FieldMap *)&executionReport,(FieldBase *)&symbol,true);
    FIX::FieldMap::setField((FieldMap *)&executionReport,(FieldBase *)&orderQty,true);
    dVar3 = FIX::DoubleField::getValue(&orderQty.super_QtyField);
    FIX::DoubleField::DoubleField((DoubleField *)local_658,0x20,dVar3,0);
    local_658._0_8_ = &PTR__FieldBase_00148ba0;
    FIX::FieldMap::setField((FieldMap *)&executionReport,(FieldBase *)local_658,true);
    FIX::FieldBase::~FieldBase((FieldBase *)local_658);
    dVar3 = FIX::DoubleField::getValue(&price.super_PriceField);
    FIX::DoubleField::DoubleField((DoubleField *)local_658,0x1f,dVar3,0);
    local_658._0_8_ = &PTR__FieldBase_00148890;
    FIX::FieldMap::setField((FieldMap *)&executionReport,(FieldBase *)local_658,true);
    FIX::FieldBase::~FieldBase((FieldBase *)local_658);
    _Var2 = FIX::FieldMap::
            lookup<__gnu_cxx::__normal_iterator<FIX::FieldBase_const*,std::vector<FIX::FieldBase,std::allocator<FIX::FieldBase>>>>
                      ((FieldMap *)message,*(FieldBase **)(message + 8),
                       *(FieldBase **)(message + 0x10),
                       account.super_StringField.super_FieldBase.m_tag);
    if (_Var2._M_current != *(FieldBase **)(message + 0x10)) {
      field = FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&account);
      FIX::FieldMap::setField((FieldMap *)&executionReport,field,true);
    }
    FIX::Session::sendToTarget((Message *)&executionReport,sessionID);
    FIX::Message::~Message((Message *)&executionReport);
    FIX::FieldBase::~FieldBase((FieldBase *)&account);
    FIX::FieldBase::~FieldBase((FieldBase *)&clOrdID);
    FIX::FieldBase::~FieldBase((FieldBase *)&price);
    FIX::FieldBase::~FieldBase((FieldBase *)&orderQty);
    FIX::FieldBase::~FieldBase((FieldBase *)&ordType);
    FIX::FieldBase::~FieldBase((FieldBase *)&side);
    FIX::FieldBase::~FieldBase((FieldBase *)&symbol);
    return;
  }
  this_00 = (IncorrectTagValue *)__cxa_allocate_exception(0x58);
  executionReport.super_Message._0_8_ = &executionReport.super_Message.field_0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&executionReport,"");
  FIX::IncorrectTagValue::IncorrectTagValue
            (this_00,ordType.super_CharField.super_FieldBase.m_tag,(string *)&executionReport);
  __cxa_throw(this_00,&FIX::IncorrectTagValue::typeinfo,FIX::Exception::~Exception);
}

Assistant:

void Application::onMessage(const FIX44::NewOrderSingle &message, const FIX::SessionID &sessionID) {
  FIX::Symbol symbol;
  FIX::Side side;
  FIX::OrdType ordType;
  FIX::OrderQty orderQty;
  FIX::Price price;
  FIX::ClOrdID clOrdID;
  FIX::Account account;

  message.get(ordType);

  if (ordType != FIX::OrdType_LIMIT) {
    throw FIX::IncorrectTagValue(ordType.getTag());
  }

  message.get(symbol);
  message.get(side);
  message.get(orderQty);
  message.get(price);
  message.get(clOrdID);

  FIX44::ExecutionReport executionReport = FIX44::ExecutionReport(
      FIX::OrderID(genOrderID()),
      FIX::ExecID(genExecID()),
      FIX::ExecType(FIX::ExecType_TRADE),
      FIX::OrdStatus(FIX::OrdStatus_FILLED),
      side,
      FIX::LeavesQty(0),
      FIX::CumQty(orderQty),
      FIX::AvgPx(price));

  executionReport.set(clOrdID);
  executionReport.set(symbol);
  executionReport.set(orderQty);
  executionReport.set(FIX::LastQty(orderQty));
  executionReport.set(FIX::LastPx(price));

  if (message.isSet(account)) {
    executionReport.setField(message.get(account));
  }

  try {
    FIX::Session::sendToTarget(executionReport, sessionID);
  } catch (FIX::SessionNotFound &) {}
}